

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

void Assimp::extractIds(string *key,int *id1,int *id2)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  string local_68 [8];
  string tmp2;
  string tmp1;
  size_type pos;
  int *id2_local;
  int *id1_local;
  string *key_local;
  
  *id1 = -1;
  *id2 = -1;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (lVar3 = std::__cxx11::string::find((char *)key,0xbb58f9), lVar3 != -1))
  {
    std::__cxx11::string::substr((ulong)((long)&tmp2.field_2 + 8),(ulong)key);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,(ulong)key);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(pcVar4);
    *id1 = iVar1;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(pcVar4);
    *id2 = iVar1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)(tmp2.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

static void extractIds( const std::string &key, int &id1, int &id2 ) {
    id1 = -1;
    id2 = -1;
    if (key.empty()) {
        return;
    }

    const std::string::size_type pos = key.find( "." );
    if (std::string::npos == pos) {
        return;
    }

    std::string tmp1 = key.substr( 0, pos );
    std::string tmp2 = key.substr( pos + 1, key.size() - pos - 1 );
    id1 = atoi( tmp1.c_str() );
    id2 = atoi( tmp2.c_str() );
}